

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseMatrix.cpp
# Opt level: O2

string * __thiscall
iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)0>::description_abi_cxx11_
          (string *__return_storage_ptr__,SparseMatrix<(iDynTree::MatrixStorageOrdering)0> *this,
          bool fullMatrix)

{
  ostream *poVar1;
  undefined7 in_register_00000011;
  size_t row;
  ulong row_00;
  size_t col;
  ulong col_00;
  double dVar2;
  const_iterator it;
  const_iterator it_1;
  ostringstream stream;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&stream);
  if ((int)CONCAT71(in_register_00000011,fullMatrix) == 0) {
    ConstIterator::ConstIterator(&it,this,true);
    while ((ConstIterator::ConstIterator(&it_1,this,false), it.m_matrix != it_1.m_matrix ||
           (it.m_index != -1))) {
      poVar1 = std::ostream::_M_insert<double>(it.m_currentTriplet.value);
      poVar1 = std::operator<<(poVar1,"(");
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      poVar1 = std::operator<<(poVar1,", ");
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::operator<<(poVar1,") ");
      ConstIterator::operator++(&it);
    }
  }
  else {
    for (row_00 = 0; row_00 < this->m_rows; row_00 = row_00 + 1) {
      for (col_00 = 0; col_00 < this->m_columns; col_00 = col_00 + 1) {
        dVar2 = operator()(this,row_00,col_00);
        poVar1 = std::ostream::_M_insert<double>(dVar2);
        std::operator<<(poVar1," ");
      }
      std::endl<char,std::char_traits<char>>((ostream *)&stream);
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&stream);
  return __return_storage_ptr__;
}

Assistant:

std::string SparseMatrix<ordering>::description(bool fullMatrix) const
    {
        std::ostringstream stream;
        if (!fullMatrix) {
            for (const_iterator it = begin(); it != end(); ++it) {
                stream << it->value << "(" << it->row << ", " << it->column << ") ";
            }
        } else {
            for (std::size_t row = 0; row < rows(); ++row) {
                for (std::size_t col = 0; col < columns(); ++col) {
                    stream << this->operator()(row, col) << " ";
                }
                stream << std::endl;
            }

        }
        return stream.str();
    }